

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  TokenType TVar2;
  Result result;
  pointer pBVar3;
  pointer pBVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pTVar7;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_fffffffffffff5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_790;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_748;
  Enum local_740;
  Enum local_73c;
  Enum local_738;
  Enum local_734;
  Location local_730;
  Enum local_70c;
  Enum local_708;
  Enum local_704;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> local_700;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr_5;
  Token local_6a8;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_658;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_64b;
  undefined1 local_64a;
  allocator local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  iterator local_620;
  size_type local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  Location local_5f8;
  Enum local_5d4;
  Location local_5d0;
  Enum local_5ac;
  Location local_5a8;
  Enum local_588;
  Enum local_584;
  Enum local_580;
  Enum local_57c;
  Location local_578;
  Enum local_554;
  iterator local_550;
  Enum local_53c;
  undefined1 local_538 [8];
  ExprList cond_1;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> local_518;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> expr_4;
  Token local_4c0;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_470;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_463;
  undefined1 local_462;
  allocator local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  iterator local_438;
  size_type local_430;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  Location local_410;
  Enum local_3ec;
  Location local_3e8;
  Enum local_3c4;
  Location local_3c0;
  Enum local_3a0;
  Enum local_39c;
  Enum local_398;
  Enum local_394;
  Location local_390;
  Enum local_36c;
  iterator local_368;
  Enum local_354;
  undefined1 local_350 [8];
  ExprList cond;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> local_330;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> expr_3;
  Token local_2d8;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_288;
  Enum local_280;
  Enum local_27c;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  local_278;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
  expr_2;
  Token local_220;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_1d0;
  Enum local_1c8;
  Enum local_1c4;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  local_1c0;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  expr_1;
  Token local_168;
  undefined1 local_118 [8];
  Location loc;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_eb;
  undefined1 local_ea;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  iterator local_c0;
  size_type local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  Enum local_98;
  Enum local_94;
  uint local_90;
  Enum local_7c;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_78;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  ExprList *exprs_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,Lpar);
  if (!bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  TVar2 = Peek(this,1);
  bVar1 = anon_unknown_1::IsPlainInstr(TVar2);
  if (bVar1) {
    Consume((Token *)&expr,this);
    Token::~Token((Token *)&expr);
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<std::default_delete<wabt::Expr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_78);
    local_7c = (Enum)ParsePlainInstr(this,&local_78);
    bVar1 = Failed((Result)local_7c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      local_94 = (Enum)ParseExprList(this,exprs);
      bVar1 = Failed((Result)local_94);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        local_ea = 1;
        local_e8 = &local_e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,"an expr",&local_e9);
        local_ea = 0;
        local_c0 = &local_e0;
        local_b8 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_eb);
        __l_01._M_len = local_b8;
        __l_01._M_array = local_c0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_b0,__l_01,&local_eb);
        local_98 = (Enum)ErrorIfLpar(this,&local_b0,(char *)0x0);
        bVar1 = Failed((Result)local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_eb);
        local_790 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
        do {
          local_790 = local_790 + -1;
          std::__cxx11::string::~string((string *)local_790);
        } while (local_790 != &local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          this_00 = (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                    ((long)&loc.field_1 + 8);
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr
                    (this_00,&local_78);
          intrusive_list<wabt::Expr>::push_back(exprs,this_00);
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr
                    ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                     ((long)&loc.field_1 + 8));
          local_90 = 0;
        }
      }
    }
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_78);
    if (local_90 != 0) {
      return (Result)this_local._4_4_;
    }
    goto LAB_016d4111;
  }
  GetLocation((Location *)local_118,this);
  TVar2 = Peek(this,1);
  switch(TVar2) {
  case Block:
    Consume(&local_168,this);
    Token::~Token(&local_168);
    Consume((Token *)&expr_1,this);
    Token::~Token((Token *)&expr_1);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
              ((wabt *)&local_1c0,(Location *)local_118);
    pBVar3 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
             ::operator->(&local_1c0);
    local_1c4 = (Enum)ParseLabelOpt(this,&(pBVar3->block).label);
    bVar1 = Failed((Result)local_1c4);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pBVar3 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
               ::operator->(&local_1c0);
      local_1c8 = (Enum)ParseBlock(this,&pBVar3->block);
      bVar1 = Failed((Result)local_1c8);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_1d0,&local_1c0);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_1d0);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_1d0);
        local_90 = 8;
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
    ::~unique_ptr(&local_1c0);
    break;
  default:
    __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x830,"Result wabt::WastParser::ParseExpr(ExprList *)");
  case IfExcept:
    Consume(&local_4c0,this);
    Token::~Token(&local_4c0);
    Consume((Token *)&expr_4,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_4);
    Token::~Token((Token *)&expr_4);
    MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_518,(Location *)local_118);
    pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::get
                       (&local_518);
    cond_1.size_._4_4_ = ParseIfExceptHeader(this,pIVar6);
    bVar1 = Failed(cond_1.size_._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      bVar1 = PeekMatchExpr(this);
      if (bVar1) {
        intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_538);
        local_53c = (Enum)ParseExpr(this,(ExprList *)local_538);
        bVar1 = Failed((Result)local_53c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          local_550 = intrusive_list<wabt::Expr>::end(exprs);
          intrusive_list<wabt::Expr>::splice
                    (exprs,(int)local_550.list_,(__off64_t *)local_550.node_,(int)local_538,in_R8,
                     in_R9,in_stack_fffffffffffff5d8);
        }
        local_90 = (uint)bVar1;
        intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_538);
        if (local_90 != 0) goto LAB_016d3c0e;
      }
      bVar1 = MatchLpar(this,Then);
      if (bVar1) {
        pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                 operator->(&local_518);
        local_554 = (Enum)ParseTerminatingInstrList(this,&(pIVar6->true_).exprs);
        bVar1 = Failed((Result)local_554);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          GetLocation(&local_578,this);
          pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                   operator->(&local_518);
          (pIVar6->true_).end_loc.filename.data_ = local_578.filename.data_;
          (pIVar6->true_).end_loc.filename.size_ = local_578.filename.size_;
          (pIVar6->true_).end_loc.field_1.field_1.offset = (size_t)local_578.field_1.field_1.offset;
          *(undefined8 *)((long)&(pIVar6->true_).end_loc.field_1 + 8) = local_578.field_1._8_8_;
          local_57c = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_57c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            bVar1 = MatchLpar(this,Else);
            if (!bVar1) {
              bVar1 = PeekMatchExpr(this);
              if (bVar1) {
                pIVar6 = std::
                         unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                         operator->(&local_518);
                local_588 = (Enum)ParseExpr(this,&pIVar6->false_);
                bVar1 = Failed((Result)local_588);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_90 = 1;
                  goto LAB_016d3c0e;
                }
              }
LAB_016d3712:
              GetLocation(&local_5a8,this);
              pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
                       ::operator->(&local_518);
              (pIVar6->false_end_loc).filename.data_ = local_5a8.filename.data_;
              (pIVar6->false_end_loc).filename.size_ = local_5a8.filename.size_;
              (pIVar6->false_end_loc).field_1.field_1.offset =
                   (size_t)local_5a8.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) = local_5a8.field_1._8_8_;
              goto LAB_016d3b9f;
            }
            pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                     operator->(&local_518);
            local_580 = (Enum)ParseTerminatingInstrList(this,&pIVar6->false_);
            bVar1 = Failed((Result)local_580);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              local_584 = (Enum)Expect(this,Rpar);
              bVar1 = Failed((Result)local_584);
              if (!bVar1) goto LAB_016d3712;
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
          }
        }
      }
      else {
        bVar1 = PeekMatchExpr(this);
        if (bVar1) {
          pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                   operator->(&local_518);
          local_5ac = (Enum)ParseExpr(this,&(pIVar6->true_).exprs);
          bVar1 = Failed((Result)local_5ac);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            GetLocation(&local_5d0,this);
            pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::
                     operator->(&local_518);
            (pIVar6->true_).end_loc.field_1.field_1.offset =
                 (size_t)local_5d0.field_1.field_1.offset;
            *(undefined8 *)((long)&(pIVar6->true_).end_loc.field_1 + 8) = local_5d0.field_1._8_8_;
            (pIVar6->true_).end_loc.filename.data_ = local_5d0.filename.data_;
            (pIVar6->true_).end_loc.filename.size_ = local_5d0.filename.size_;
            bVar1 = PeekMatchExpr(this);
            if (bVar1) {
              pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
                       ::operator->(&local_518);
              local_5d4 = (Enum)ParseExpr(this,&pIVar6->false_);
              bVar1 = Failed((Result)local_5d4);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_90 = 1;
                goto LAB_016d3c0e;
              }
              GetLocation(&local_5f8,this);
              pIVar6 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
                       ::operator->(&local_518);
              (pIVar6->false_end_loc).filename.data_ = local_5f8.filename.data_;
              (pIVar6->false_end_loc).filename.size_ = local_5f8.filename.size_;
              (pIVar6->false_end_loc).field_1.field_1.offset =
                   (size_t)local_5f8.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) = local_5f8.field_1._8_8_;
            }
LAB_016d3b9f:
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
            unique_ptr<wabt::IfExceptExpr,std::default_delete<wabt::IfExceptExpr>,void>
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_658,
                       &local_518);
            intrusive_list<wabt::Expr>::push_back(exprs,&local_658);
            std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_658);
            local_90 = 8;
          }
        }
        else {
          ConsumeIfLpar(this);
          local_64a = 1;
          local_648 = &local_640;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_640,"then block",&local_649);
          local_64a = 0;
          local_620 = &local_640;
          local_618 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_64b);
          __l._M_len = local_618;
          __l._M_array = local_620;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_610,__l,&local_64b);
          this_local._4_4_ = ErrorExpected(this,&local_610,"(then ...)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_610);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_64b);
          local_980 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_620;
          do {
            local_980 = local_980 + -1;
            std::__cxx11::string::~string((string *)local_980);
          } while (local_980 != &local_640);
          std::allocator<char>::~allocator((allocator<char> *)&local_649);
          local_90 = 1;
        }
      }
    }
LAB_016d3c0e:
    std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::~unique_ptr
              (&local_518);
    goto joined_r0x016d31a9;
  case If:
    Consume(&local_2d8,this);
    Token::~Token(&local_2d8);
    Consume((Token *)&expr_3,this);
    Token::~Token((Token *)&expr_3);
    MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_330,(Location *)local_118);
    pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                       (&local_330);
    cond.size_._4_4_ = ParseLabelOpt(this,&(pIVar5->true_).label);
    bVar1 = Failed(cond.size_._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                         (&local_330);
      cond.size_._0_4_ = ParseBlockDeclaration(this,&(pIVar5->true_).decl);
      bVar1 = Failed(cond.size_._0_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        bVar1 = PeekMatchExpr(this);
        if (bVar1) {
          intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_350);
          local_354 = (Enum)ParseExpr(this,(ExprList *)local_350);
          bVar1 = Failed((Result)local_354);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            local_368 = intrusive_list<wabt::Expr>::end(exprs);
            intrusive_list<wabt::Expr>::splice
                      (exprs,(int)local_368.list_,(__off64_t *)local_368.node_,(int)local_350,in_R8,
                       in_R9,in_stack_fffffffffffff5d8);
          }
          local_90 = (uint)bVar1;
          intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_350);
          if (local_90 != 0) goto LAB_016d3194;
        }
        bVar1 = MatchLpar(this,Then);
        if (bVar1) {
          pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             (&local_330);
          local_36c = (Enum)ParseTerminatingInstrList(this,&(pIVar5->true_).exprs);
          bVar1 = Failed((Result)local_36c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            GetLocation(&local_390,this);
            pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               (&local_330);
            (pIVar5->true_).end_loc.filename.data_ = local_390.filename.data_;
            (pIVar5->true_).end_loc.filename.size_ = local_390.filename.size_;
            (pIVar5->true_).end_loc.field_1.field_1.offset =
                 (size_t)local_390.field_1.field_1.offset;
            *(undefined8 *)((long)&(pIVar5->true_).end_loc.field_1 + 8) = local_390.field_1._8_8_;
            local_394 = (Enum)Expect(this,Rpar);
            bVar1 = Failed((Result)local_394);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              bVar1 = MatchLpar(this,Else);
              if (!bVar1) {
                bVar1 = PeekMatchExpr(this);
                if (bVar1) {
                  pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                           operator->(&local_330);
                  local_3a0 = (Enum)ParseExpr(this,&pIVar5->false_);
                  bVar1 = Failed((Result)local_3a0);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    local_90 = 1;
                    goto LAB_016d3194;
                  }
                }
LAB_016d2c98:
                GetLocation(&local_3c0,this);
                pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                         operator->(&local_330);
                (pIVar5->false_end_loc).filename.data_ = local_3c0.filename.data_;
                (pIVar5->false_end_loc).filename.size_ = local_3c0.filename.size_;
                (pIVar5->false_end_loc).field_1.field_1.offset =
                     (size_t)local_3c0.field_1.field_1.offset;
                *(undefined8 *)((long)&(pIVar5->false_end_loc).field_1 + 8) =
                     local_3c0.field_1._8_8_;
                goto LAB_016d3125;
              }
              pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                                 (&local_330);
              local_398 = (Enum)ParseTerminatingInstrList(this,&pIVar5->false_);
              bVar1 = Failed((Result)local_398);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_90 = 1;
              }
              else {
                local_39c = (Enum)Expect(this,Rpar);
                bVar1 = Failed((Result)local_39c);
                if (!bVar1) goto LAB_016d2c98;
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_90 = 1;
              }
            }
          }
        }
        else {
          bVar1 = PeekMatchExpr(this);
          if (bVar1) {
            pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               (&local_330);
            local_3c4 = (Enum)ParseExpr(this,&(pIVar5->true_).exprs);
            bVar1 = Failed((Result)local_3c4);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              GetLocation(&local_3e8,this);
              pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                                 (&local_330);
              (pIVar5->true_).end_loc.field_1.field_1.offset =
                   (size_t)local_3e8.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar5->true_).end_loc.field_1 + 8) = local_3e8.field_1._8_8_;
              (pIVar5->true_).end_loc.filename.data_ = local_3e8.filename.data_;
              (pIVar5->true_).end_loc.filename.size_ = local_3e8.filename.size_;
              bVar1 = PeekMatchExpr(this);
              if (bVar1) {
                pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                         operator->(&local_330);
                local_3ec = (Enum)ParseExpr(this,&pIVar5->false_);
                bVar1 = Failed((Result)local_3ec);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_90 = 1;
                  goto LAB_016d3194;
                }
                GetLocation(&local_410,this);
                pIVar5 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                         operator->(&local_330);
                (pIVar5->false_end_loc).filename.data_ = local_410.filename.data_;
                (pIVar5->false_end_loc).filename.size_ = local_410.filename.size_;
                (pIVar5->false_end_loc).field_1.field_1.offset =
                     (size_t)local_410.field_1.field_1.offset;
                *(undefined8 *)((long)&(pIVar5->false_end_loc).field_1 + 8) =
                     local_410.field_1._8_8_;
              }
LAB_016d3125:
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
              unique_ptr<wabt::IfExpr,std::default_delete<wabt::IfExpr>,void>
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_470,
                         &local_330);
              intrusive_list<wabt::Expr>::push_back(exprs,&local_470);
              std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_470)
              ;
              local_90 = 8;
            }
          }
          else {
            ConsumeIfLpar(this);
            local_462 = 1;
            local_460 = &local_458;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_458,"then block",&local_461);
            local_462 = 0;
            local_438 = &local_458;
            local_430 = 1;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_463);
            __l_00._M_len = local_430;
            __l_00._M_array = local_438;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_428,__l_00,&local_463);
            this_local._4_4_ = ErrorExpected(this,&local_428,"(then ...)");
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_428);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_463);
            local_8a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_438;
            do {
              local_8a8 = local_8a8 + -1;
              std::__cxx11::string::~string((string *)local_8a8);
            } while (local_8a8 != &local_458);
            std::allocator<char>::~allocator((allocator<char> *)&local_461);
            local_90 = 1;
          }
        }
      }
    }
LAB_016d3194:
    std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr(&local_330);
joined_r0x016d31a9:
    if (local_90 == 1) {
      return (Result)this_local._4_4_;
    }
    goto LAB_016d4111;
  case Loop:
    Consume(&local_220,this);
    Token::~Token(&local_220);
    Consume((Token *)&expr_2,this);
    Token::~Token((Token *)&expr_2);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
              ((wabt *)&local_278,(Location *)local_118);
    pBVar4 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
             ::operator->(&local_278);
    local_27c = (Enum)ParseLabelOpt(this,&(pBVar4->block).label);
    bVar1 = Failed((Result)local_27c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pBVar4 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
               ::operator->(&local_278);
      local_280 = (Enum)ParseBlock(this,&pBVar4->block);
      bVar1 = Failed((Result)local_280);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_288,&local_278);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_288);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_288);
        local_90 = 8;
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)22>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)22>_>_>
    ::~unique_ptr(&local_278);
    break;
  case Try:
    Consume(&local_6a8,this);
    Token::~Token(&local_6a8);
    Consume((Token *)&expr_5,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_5);
    Token::~Token((Token *)&expr_5);
    MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_700,(Location *)local_118);
    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                       (&local_700);
    local_704 = (Enum)ParseLabelOpt(this,&(pTVar7->block).label);
    bVar1 = Failed((Result)local_704);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                         (&local_700);
      local_708 = (Enum)ParseBlockDeclaration(this,&(pTVar7->block).decl);
      bVar1 = Failed((Result)local_708);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                           (&local_700);
        local_70c = (Enum)ParseInstrList(this,&(pTVar7->block).exprs);
        bVar1 = Failed((Result)local_70c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          GetLocation(&local_730,this);
          pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                             (&local_700);
          (pTVar7->block).end_loc.filename.data_ = local_730.filename.data_;
          (pTVar7->block).end_loc.filename.size_ = local_730.filename.size_;
          (pTVar7->block).end_loc.field_1.field_1.offset = (size_t)local_730.field_1.field_1.offset;
          *(undefined8 *)((long)&(pTVar7->block).end_loc.field_1 + 8) = local_730.field_1._8_8_;
          local_734 = (Enum)Expect(this,Lpar);
          bVar1 = Failed((Result)local_734);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            local_738 = (Enum)Expect(this,Catch);
            bVar1 = Failed((Result)local_738);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                       operator->(&local_700);
              local_73c = (Enum)ParseTerminatingInstrList(this,&pTVar7->catch_);
              bVar1 = Failed((Result)local_73c);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_90 = 1;
              }
              else {
                local_740 = (Enum)Expect(this,Rpar);
                bVar1 = Failed((Result)local_740);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_90 = 1;
                }
                else {
                  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
                  unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>,void>
                            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_748,
                             &local_700);
                  intrusive_list<wabt::Expr>::push_back(exprs,&local_748);
                  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr
                            (&local_748);
                  local_90 = 8;
                }
              }
            }
          }
        }
      }
    }
    std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr(&local_700);
  }
  if (local_90 != 1) {
LAB_016d4111:
    result = Expect(this,Rpar);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = MakeUnique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = MakeUnique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = MakeUnique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::IfExcept: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = MakeUnique<IfExceptExpr>(loc);

        CHECK_RESULT(ParseIfExceptHeader(expr.get()));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = MakeUnique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        EXPECT(Lpar);
        EXPECT(Catch);
        CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
        EXPECT(Rpar);
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}